

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# card.c
# Opt level: O0

char * cards_print(Card **cards,uchar cardsCount,_Bool showDownCards)

{
  code *pcVar1;
  char *__src;
  ulong uVar2;
  byte in_SIL;
  uchar i;
  undefined1 in_stack_ffffffffffffffdf;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  byte local_b;
  
  if (cardsPrintBufIndex == 0xff) {
    cardsPrintBufIndex = '\0';
  }
  memset(cardsPrintBufs + cardsPrintBufIndex,0,0xff);
  for (local_b = 0; local_b < in_SIL; local_b = local_b + 1) {
    if (local_b != 0) {
      strcat(cardsPrintBufs[cardsPrintBufIndex]," ");
    }
    uVar2 = (ulong)cardsPrintBufIndex;
    __src = card_print((Card *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                       (_Bool)in_stack_ffffffffffffffdf);
    strcat(cardsPrintBufs[uVar2],__src);
  }
  cardsPrintBufIndex = cardsPrintBufIndex + 1;
  if (SBORROW4((uint)cardsPrintBufIndex,1)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  return cardsPrintBufs[(int)(cardsPrintBufIndex - 1)];
}

Assistant:

char * cards_print(Card ** cards, unsigned char cardsCount, bool showDownCards)
{
	unsigned char i;
	if(cardsPrintBufIndex>=255)
		cardsPrintBufIndex = 0;

	memset(cardsPrintBufs[cardsPrintBufIndex], 0, 255);

	for(i=0;i<cardsCount;i++)
	{
		if(i>0)
			strcat(cardsPrintBufs[cardsPrintBufIndex], " ");

		strcat(cardsPrintBufs[cardsPrintBufIndex], card_print(cards[i], showDownCards));
	}

	cardsPrintBufIndex++;
	return cardsPrintBufs[(cardsPrintBufIndex-1)];
}